

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall kj::Canceler::release(Canceler *this)

{
  long lVar1;
  
  lVar1 = *(long *)this;
  while (lVar1 != 0) {
    *(undefined8 *)this = *(undefined8 *)(lVar1 + 0x10);
    *(undefined8 *)(lVar1 + 8) = 0;
    *(undefined8 *)(lVar1 + 0x10) = 0;
    lVar1 = *(long *)this;
  }
  return;
}

Assistant:

inline T* readMaybe(const Maybe<T&>& maybe) { return maybe.ptr; }